

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

void __thiscall siamese::EncoderPacketWindow::ClearWindow(EncoderPacketWindow *this)

{
  uint laneIndex;
  long lVar1;
  EncoderPacketWindow *pEVar2;
  long lVar3;
  
  this->Count = 0;
  this->LongestPacket = 0;
  this->FirstUnremovedElement = 0;
  this->SumStartElement = 0;
  this->SumEndElement = 0;
  pEVar2 = this;
  for (lVar1 = 0; lVar3 = -0xc, lVar1 != 8; lVar1 = lVar1 + 1) {
    for (; lVar3 != 0; lVar3 = lVar3 + 4) {
      pEVar2->Lanes[1].NextElement[lVar3] = 0;
      *(int *)((long)pEVar2->Lanes[0].Sum + lVar3 + -4) = (int)lVar1;
    }
    this->Lanes[lVar1].LongestPacket = 0;
    pEVar2 = (EncoderPacketWindow *)((pEVar2->Subwindows).PreallocatedData + 2);
  }
  return;
}

Assistant:

void EncoderPacketWindow::ClearWindow()
{
    FirstUnremovedElement = 0;
    Count                 = 0;
    LongestPacket         = 0;
    SumStartElement       = 0;
    SumEndElement         = 0;

    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex)
    {
        EncoderColumnLane& lane = Lanes[laneIndex];

        for (unsigned sumIndex = 0; sumIndex < kColumnSumCount; ++sumIndex)
        {
            lane.Sum[sumIndex].Bytes   = 0;
            lane.NextElement[sumIndex] = laneIndex;
        }
        lane.LongestPacket = 0;
    }
}